

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

SharedNumberFormat *
icu_63::NumberFormat::createSharedInstance(Locale *loc,UNumberFormatStyle kind,UErrorCode *status)

{
  UBool UVar1;
  Locale *local_30;
  SharedNumberFormat *result;
  UErrorCode *status_local;
  Locale *pLStack_18;
  UNumberFormatStyle kind_local;
  Locale *loc_local;
  
  result = (SharedNumberFormat *)status;
  status_local._4_4_ = kind;
  pLStack_18 = loc;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (status_local._4_4_ == UNUM_DECIMAL) {
      local_30 = (Locale *)0x0;
      UnifiedCache::getByLocale<icu_63::SharedNumberFormat>
                (pLStack_18,(SharedNumberFormat **)&local_30,(UErrorCode *)result);
      loc_local = local_30;
    }
    else {
      *(undefined4 *)&(result->super_SharedObject).super_UObject._vptr_UObject = 0x10;
      loc_local = (Locale *)0x0;
    }
  }
  else {
    loc_local = (Locale *)0x0;
  }
  return (SharedNumberFormat *)loc_local;
}

Assistant:

const SharedNumberFormat* U_EXPORT2
NumberFormat::createSharedInstance(const Locale& loc, UNumberFormatStyle kind, UErrorCode& status) {
    if (U_FAILURE(status)) {
        return NULL;
    }
    if (kind != UNUM_DECIMAL) {
        status = U_UNSUPPORTED_ERROR;
        return NULL;
    }
    const SharedNumberFormat *result = NULL;
    UnifiedCache::getByLocale(loc, result, status);
    return result;
}